

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_PLTerm_Test::TestBody(ExprTest_PLTerm_Test *this)

{
  bool bVar1;
  ExprFactory *this_00;
  char *pcVar2;
  AssertHelper local_80;
  Reference arg;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertionResult gtest_ar_;
  ExprBase local_48;
  AssertHelper local_40;
  Reference var;
  PLTermBuilder local_30;
  
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  this_00 = &(this->super_ExprTest).factory_;
  local_30 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm(this_00,2);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_30,11.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_30,111.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_30,22.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_30,222.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_30,33.0);
  var = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0x2a);
  local_48.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm(this_00,local_30,var);
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ = 0x28;
  local_80.data_._0_4_ = (local_48.impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&gtest_ar_,"expr::PLTERM","e.kind()",(Kind *)&arg,(Kind *)&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf3,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ = 2;
  local_80.data_._0_4_ = local_48.impl_[1].kind_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"2","e.num_breakpoints()",(int *)&arg,(int *)&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf4,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ = 3;
  local_80.data_._0_4_ = local_48.impl_[1].kind_ + FIRST_EXPR;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"3","e.num_slopes()",(int *)&arg,(int *)&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf5,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_80.data_._0_4_ = 0xb;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)mp::PLTerm::slope((PLTerm *)&local_48,0);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_,"11","e.slope(0)",(int *)&local_80,(double *)&arg);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf6,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_80.data_._0_4_ = 0x16;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)mp::PLTerm::slope((PLTerm *)&local_48,1);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_,"22","e.slope(1)",(int *)&local_80,(double *)&arg);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf7,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_80.data_._0_4_ = 0x21;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)mp::PLTerm::slope((PLTerm *)&local_48,2);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_,"33","e.slope(2)",(int *)&local_80,(double *)&arg);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf8,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if ((char)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ == '\x01'
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"index out of bounds",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::slope((PLTerm *)&local_48,-1);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&arg,
               (char (*) [97])
               "Expected: e.slope(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf9,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_70);
  testing::AssertionSuccess();
  if ((char)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ == '\x01'
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"index out of bounds",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::slope((PLTerm *)&local_48,3);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&arg,
               (char (*) [96])
               "Expected: e.slope(3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfa,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_70);
  local_80.data_._0_4_ = 0x6f;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)
       mp::PLTerm::breakpoint((PLTerm *)&local_48,0);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_,"111","e.breakpoint(0)",(int *)&local_80,(double *)&arg);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfb,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_80.data_._0_4_ = 0xde;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)
       mp::PLTerm::breakpoint((PLTerm *)&local_48,1);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_,"222","e.breakpoint(1)",(int *)&local_80,(double *)&arg);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfc,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if ((char)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ == '\x01'
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"index out of bounds",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::breakpoint((PLTerm *)&local_48,-1);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&arg,
               (char (*) [102])
               "Expected: e.breakpoint(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfd,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_70);
  testing::AssertionSuccess();
  if ((char)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ == '\x01'
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"index out of bounds",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::breakpoint((PLTerm *)&local_48,2);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&arg,
               (char (*) [101])
               "Expected: e.breakpoint(2) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfe,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_70);
  arg = mp::PLTerm::arg((PLTerm *)&local_48);
  testing::internal::CmpHelperEQ<mp::Reference,mp::Reference>
            ((internal *)&gtest_ar_,"var","e.arg()",&var,&arg);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&arg);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xff,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&arg);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&arg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::AssertionSuccess();
  if ((char)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ == '\x01'
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"invalid number of breakpoints",(allocator<char> *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm(this_00,0);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&arg,
               (char (*) [109])
               "Expected: factory_.BeginPLTerm(0) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x100,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_70);
  local_30 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm(this_00,1);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_30,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_30,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_30,1.0);
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr(this_00,0);
  local_48.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm(this_00,local_30,arg);
  local_80.data_ = (AssertHelperData *)mp::PLTerm::arg((PLTerm *)&local_48);
  testing::internal::CmpHelperEQ<mp::Reference,mp::Reference>
            ((internal *)&gtest_ar_,"arg","e.arg()",&arg,(Reference *)&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x107
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ExprTest, PLTerm) {
  mp::PLTerm e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  ExprFactory::PLTermBuilder builder = factory_.BeginPLTerm(2);
  builder.AddSlope(11);
  builder.AddBreakpoint(111);
  builder.AddSlope(22);
  builder.AddBreakpoint(222);
  builder.AddSlope(33);
  auto var = factory_.MakeVariable(42);
  e = factory_.EndPLTerm(builder, var);
  EXPECT_EQ(expr::PLTERM, e.kind());
  EXPECT_EQ(2, e.num_breakpoints());
  EXPECT_EQ(3, e.num_slopes());
  EXPECT_EQ(11, e.slope(0));
  EXPECT_EQ(22, e.slope(1));
  EXPECT_EQ(33, e.slope(2));
  EXPECT_ASSERT(e.slope(-1), "index out of bounds");
  EXPECT_ASSERT(e.slope(3), "index out of bounds");
  EXPECT_EQ(111, e.breakpoint(0));
  EXPECT_EQ(222, e.breakpoint(1));
  EXPECT_ASSERT(e.breakpoint(-1), "index out of bounds");
  EXPECT_ASSERT(e.breakpoint(2), "index out of bounds");
  EXPECT_EQ(var, e.arg());
  EXPECT_ASSERT(factory_.BeginPLTerm(0), "invalid number of breakpoints");
  builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddBreakpoint(0);
  builder.AddSlope(1);
  auto arg = factory_.MakeCommonExpr(0);
  e = factory_.EndPLTerm(builder, arg);
  EXPECT_EQ(arg, e.arg());
}